

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

bool DestroyDB(string *path_str)

{
  long in_FS_OFFSET;
  Options OStack_88;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  leveldb::Options::Options(&OStack_88);
  leveldb::DestroyDB((leveldb *)&local_28,path_str,&OStack_88);
  leveldb::Status::~Status((Status *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return local_28 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool DestroyDB(const std::string& path_str)
{
    return leveldb::DestroyDB(path_str, {}).ok();
}